

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_linear.cpp
# Opt level: O1

void __thiscall
mp::
BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::SinId>_>
::ConsiderIntegrality
          (BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::SinId>_>
           *this)

{
  PLApproxParams *pPVar1;
  pointer pdVar2;
  pointer pdVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  double y;
  
  pPVar1 = this->laPrm_;
  if ((pPVar1->is_x_int == true) && (pPVar1->fUsePeriod == false)) {
    dVar6 = (pPVar1->grDomOut).ubx;
    dVar5 = ceil((pPVar1->grDomOut).lbx);
    dVar6 = floor(dVar6);
    iVar4 = (int)((dVar6 - dVar5) + 1.0);
    pdVar2 = (pPVar1->plPoints).x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pdVar3 = (pPVar1->plPoints).x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar4 <= (int)((ulong)((long)pdVar2 - (long)pdVar3) >> 3)) {
      if (pdVar2 != pdVar3) {
        (pPVar1->plPoints).x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = pdVar3;
      }
      pdVar2 = (pPVar1->plPoints).y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((pPVar1->plPoints).y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish != pdVar2) {
        (pPVar1->plPoints).y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = pdVar2;
      }
      if (0 < iVar4) {
        dVar6 = 0.0;
        do {
          pPVar1 = this->laPrm_;
          (*this->_vptr_BasicPLApproximator[9])(dVar5 + dVar6,this);
          PLPoints::AddPoint(&pPVar1->plPoints,dVar5 + dVar6,y);
          dVar6 = dVar6 + 1.0;
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
    }
  }
  return;
}

Assistant:

void BasicPLApproximator<FuncCon>::ConsiderIntegrality() {
  /// Simple case when N breakpoints >= N integer points
  if (laPrm_.is_x_int && !laPrm_.fUsePeriod) {
    auto x0=std::ceil(laPrm_.grDomOut.lbx);
    auto xN=std::floor(laPrm_.grDomOut.ubx);
    auto N = int(xN - x0 + 1);
    if (N <= laPrm_.plPoints.size()) {
      laPrm_.plPoints.clear();
      for (int k=0; k<N; ++k)       // use double + int
        laPrm_.plPoints.AddPoint(x0+k, eval(x0+k));
    }
  }
}